

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

void __thiscall adios2::Engine::LockWriterDefinitions(Engine *this)

{
  Engine *pointer;
  allocator local_39;
  string local_38;
  
  pointer = this->m_Engine;
  std::__cxx11::string::string
            ((string *)&local_38,"in call to Engine::LockWriterDefinitions",&local_39);
  helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  adios2::core::Engine::LockWriterDefinitions();
  return;
}

Assistant:

void Engine::LockWriterDefinitions()
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::LockWriterDefinitions");
    m_Engine->LockWriterDefinitions();
}